

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O3

void __thiscall spvtools::opt::MemPass::RemoveBlock(MemPass *this,iterator *bi)

{
  BasicBlock *pBVar1;
  iterator __position;
  pointer puVar2;
  char cVar3;
  Instruction *pIVar4;
  Instruction *pIVar5;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> *local_78;
  undefined8 local_70;
  code *local_68;
  code *local_60;
  Instruction *local_58;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_50;
  MemPass *local_48;
  code *local_40;
  code *local_38;
  
  pBVar1 = (((bi->iterator_)._M_current)->_M_t).
           super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
           .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
  local_78 = &local_50;
  local_38 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/mem_pass.cpp:401:24)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/mem_pass.cpp:401:24)>
             ::_M_manager;
  local_70 = 0;
  local_60 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:295:7)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:295:7)>
             ::_M_manager;
  pIVar4 = *(Instruction **)
            ((long)&(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  local_50._M_head_impl = pBVar1;
  local_48 = this;
  if ((pIVar4 != (Instruction *)0x0) &&
     ((pIVar4->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    do {
      if (pIVar4 == (Instruction *)0x0) break;
      pIVar5 = (pIVar4->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      local_58 = pIVar4;
      if (local_68 == (code *)0x0) {
        std::__throw_bad_function_call();
      }
      if ((pIVar5->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar5 = (Instruction *)0x0;
      }
      cVar3 = (*local_60)(&local_78,&local_58);
      pIVar4 = pIVar5;
    } while (cVar3 != '\0');
    if (local_68 == (code *)0x0) goto LAB_005f25d4;
  }
  (*local_68)(&local_78,&local_78,3);
LAB_005f25d4:
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,3);
  }
  IRContext::KillInst((this->super_Pass).context_,
                      (Instruction *)
                      (pBVar1->label_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     );
  __position._M_current = (bi->iterator_)._M_current;
  puVar2 = (bi->container_->
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  std::
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  ::_M_erase(bi->container_,__position);
  (bi->iterator_)._M_current =
       (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *)
       ((long)__position._M_current +
       ((long)(bi->container_->
              super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start - (long)puVar2));
  return;
}

Assistant:

void MemPass::RemoveBlock(Function::iterator* bi) {
  auto& rm_block = **bi;

  // Remove instructions from the block.
  rm_block.ForEachInst([&rm_block, this](Instruction* inst) {
    // Note that we do not kill the block label instruction here. The label
    // instruction is needed to identify the block, which is needed by the
    // removal of phi operands.
    if (inst != rm_block.GetLabelInst()) {
      context()->KillInst(inst);
    }
  });

  // Remove the label instruction last.
  auto label = rm_block.GetLabelInst();
  context()->KillInst(label);

  *bi = bi->Erase();
}